

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

btScalar __thiscall
btCollisionWorld::
objectQuerySingleInternal(btConvexShape_const*,btTransform_const&,btTransform_const&,btCollisionObjectWrapper_const*,btCollisionWorld
::ConvexResultCallback&,float)::LocalInfoAdder::addSingleResult(btCollisionWorld::
LocalConvexResult__bool_(LocalInfoAdder *this,LocalConvexResult *r,bool b)

{
  byte in_DL;
  long in_RSI;
  long in_RDI;
  btScalar bVar1;
  btScalar result;
  LocalShapeInfo shapeInfo;
  undefined4 local_1c;
  undefined4 local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_1c = 0xffffffff;
  local_18 = *(undefined4 *)(in_RDI + 0x18);
  if (*(long *)(in_RSI + 8) == 0) {
    *(undefined4 **)(in_RSI + 8) = &local_1c;
  }
  bVar1 = (btScalar)
          (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
                    (*(long **)(in_RDI + 0x10),in_RSI,local_11);
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8);
  return bVar1;
}

Assistant:

virtual btScalar addSingleResult (btCollisionWorld::LocalConvexResult&	r,	bool b)
                            {
                                    btCollisionWorld::LocalShapeInfo	shapeInfo;
                                    shapeInfo.m_shapePart = -1;
                                    shapeInfo.m_triangleIndex = m_i;
                                    if (r.m_localShapeInfo == NULL)
                                        r.m_localShapeInfo = &shapeInfo;
									const btScalar result = m_userCallback->addSingleResult(r, b);
									m_closestHitFraction = m_userCallback->m_closestHitFraction;
									return result;
                                    
                            }